

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bit-map-type.cpp
# Opt level: O1

void __thiscall
yactfr::FixedLengthBitMapType::FixedLengthBitMapType
          (FixedLengthBitMapType *this,uint align,uint len,ByteOrder bo,Flags *flags,
          optional<yactfr::BitOrder> *bio,Up *attrs)

{
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_20;
  
  local_20._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  FixedLengthBitArrayType::FixedLengthBitArrayType
            (&this->super_FixedLengthBitArrayType,_kindFlBitMap,align,len,bo,bio,(Up *)&local_20);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_20);
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)&PTR__FixedLengthBitMapType_0030ab08;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_flags)._M_t._M_impl.super__Rb_tree_header,
             &(flags->_M_t)._M_impl.super__Rb_tree_header);
  _flagMasksFromFlags(&this->_flagMasks,&this->_flags);
  return;
}

Assistant:

FixedLengthBitMapType::FixedLengthBitMapType(const unsigned int align, const unsigned int len,
                                             const ByteOrder bo, Flags flags,
                                             const boost::optional<BitOrder>& bio,
                                             MapItem::Up attrs) :
    FixedLengthBitArrayType {_kindFlBitMap, align, len, bo, bio, std::move(attrs)},
    _flags {std::move(flags)},
    _flagMasks {this->_flagMasksFromFlags(_flags)}
{
}